

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O1

void ixgbe_read_stats(ixy_device *ixy,device_stats *stats)

{
  undefined1 auVar1 [32];
  ixgbe_device *dev;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  
  if (stats != (device_stats *)0x0) {
    auVar2._4_4_ = *(undefined4 *)(ixy[1].pci_addr + 0x4094);
    auVar2._0_4_ = *(undefined4 *)(ixy[1].pci_addr + 0x4090);
    auVar4._4_4_ = *(undefined4 *)(ixy[1].pci_addr + 0x408c);
    auVar4._0_4_ = *(undefined4 *)(ixy[1].pci_addr + 0x4088);
    auVar2._8_8_ = 0;
    auVar4._8_8_ = 0;
    auVar2 = vpunpcklqdq_avx(auVar4,auVar2);
    auVar4 = vpunpcklqdq_avx(ZEXT416(*(uint *)(ixy[1].pci_addr + 0x4074)),
                             ZEXT416(*(uint *)(ixy[1].pci_addr + 0x4080)));
    auVar3._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
    auVar3._16_16_ = ZEXT116(1) * auVar2;
    auVar1._0_8_ = stats->rx_pkts;
    auVar1._8_8_ = stats->tx_pkts;
    auVar1._16_8_ = stats->rx_bytes;
    auVar1._24_8_ = stats->tx_bytes;
    auVar1 = vpaddq_avx2(auVar3,auVar1);
    stats->rx_pkts = auVar1._0_8_;
    stats->tx_pkts = auVar1._8_8_;
    stats->rx_bytes = auVar1._16_8_;
    stats->tx_bytes = auVar1._24_8_;
  }
  return;
}

Assistant:

void ixgbe_read_stats(struct ixy_device* ixy, struct device_stats* stats) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);
	uint32_t rx_pkts = get_reg32(dev->addr, IXGBE_GPRC);
	uint32_t tx_pkts = get_reg32(dev->addr, IXGBE_GPTC);
	uint64_t rx_bytes = get_reg32(dev->addr, IXGBE_GORCL) + (((uint64_t) get_reg32(dev->addr, IXGBE_GORCH)) << 32);
	uint64_t tx_bytes = get_reg32(dev->addr, IXGBE_GOTCL) + (((uint64_t) get_reg32(dev->addr, IXGBE_GOTCH)) << 32);
	if (stats) {
		stats->rx_pkts += rx_pkts;
		stats->tx_pkts += tx_pkts;
		stats->rx_bytes += rx_bytes;
		stats->tx_bytes += tx_bytes;
	}
}